

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

response * __thiscall
CppWebSpider::requests::get
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   data,CookieJar *cookie,int timeout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int sockfd;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  long *plVar6;
  int iVar7;
  requests *this_00;
  _Alloc_hider _Var8;
  EVP_PKEY_CTX *this_01;
  undefined6 in_register_00000082;
  __node_base_ptr p_Var9;
  bool bVar10;
  string sendmsg;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  response *local_1c0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (host->_M_dataplus)._M_p;
  this_01 = (EVP_PKEY_CTX *)local_70;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + host->_M_string_length,uri,
             CONCAT62(in_register_00000082,port));
  sockfd = init((requests *)this_01,(EVP_PKEY_CTX *)local_70);
  local_1b8 = headers;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (sockfd < 0) {
    pcVar2 = (host->_M_dataplus)._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + host->_M_string_length);
    pcVar2 = (uri->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + uri->_M_string_length);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    response::response(__return_storage_ptr__,&local_90,&local_b0,&local_d0,
                       (CookieJar *)data._M_h._M_bucket_count);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    _Var8._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_1c0 = __return_storage_ptr__;
    if (data._M_h._M_buckets[3] != (__node_base_ptr)0x0) {
      std::__cxx11::string::append((char *)uri);
    }
    p_Var9 = data._M_h._M_buckets[2];
    if (p_Var9 != (__node_base_ptr)0x0) {
      iVar7 = 0;
      do {
        bVar10 = iVar7 != 0;
        iVar7 = iVar7 + -1;
        if (bVar10) {
          std::__cxx11::string::append((char *)uri);
        }
        std::operator+(&local_1e0,uri,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 1));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e0);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_200.field_2._M_allocated_capacity = *psVar5;
          local_200.field_2._8_8_ = plVar3[3];
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        }
        else {
          local_200.field_2._M_allocated_capacity = *psVar5;
          local_200._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_200._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_200,(ulong)p_Var9[5]._M_nxt)
        ;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar5) {
          sendmsg.field_2._M_allocated_capacity = *psVar5;
          sendmsg.field_2._8_8_ = plVar3[3];
          sendmsg._M_dataplus._M_p = (pointer)&sendmsg.field_2;
        }
        else {
          sendmsg.field_2._M_allocated_capacity = *psVar5;
          sendmsg._M_dataplus._M_p = (pointer)*plVar3;
        }
        sendmsg._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)uri,(string *)&sendmsg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sendmsg._M_dataplus._M_p != &sendmsg.field_2) {
          operator_delete(sendmsg._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        p_Var9 = p_Var9->_M_nxt;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    std::operator+(&local_50,"GET ",uri);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_1a0 = *plVar6;
      lStack_198 = plVar3[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *plVar6;
      local_1b0 = (long *)*plVar3;
    }
    local_1a8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1b0);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1e0.field_2._M_allocated_capacity = *psVar5;
      local_1e0.field_2._8_8_ = plVar3[3];
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *psVar5;
      local_1e0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1e0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)(host->_M_dataplus)._M_p);
    paVar1 = &local_200.field_2;
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_200.field_2._M_allocated_capacity = *psVar5;
      local_200.field_2._8_8_ = puVar4[3];
      local_200._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_200.field_2._M_allocated_capacity = *psVar5;
      local_200._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_200._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_200);
    sendmsg._M_dataplus._M_p = (pointer)&sendmsg.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      sendmsg.field_2._M_allocated_capacity = *psVar5;
      sendmsg.field_2._8_8_ = plVar3[3];
    }
    else {
      sendmsg.field_2._M_allocated_capacity = *psVar5;
      sendmsg._M_dataplus._M_p = (pointer)*plVar3;
    }
    sendmsg._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,sendmsg._M_dataplus._M_p,
               sendmsg._M_dataplus._M_p + sendmsg._M_string_length);
    pcVar2 = (host->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + host->_M_string_length);
    this_00 = (requests *)(uri->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,this_00,this_00 + uri->_M_string_length);
    make_header(&local_200,this_00,&local_f0,&local_110,&local_130,local_1b8,
                (CookieJar *)data._M_h._M_bucket_count);
    std::__cxx11::string::operator=((string *)&sendmsg,(string *)&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != paVar1) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    __return_storage_ptr__ = local_1c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    pcVar2 = (host->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar2,pcVar2 + host->_M_string_length);
    pcVar2 = (uri->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar2,pcVar2 + uri->_M_string_length);
    _Var8 = sendmsg._M_dataplus;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,sendmsg._M_dataplus._M_p,
               sendmsg._M_dataplus._M_p + sendmsg._M_string_length);
    request_and_recv(__return_storage_ptr__,(requests *)_Var8._M_p,&local_150,&local_170,sockfd,
                     &local_190,(CookieJar *)data._M_h._M_bucket_count,
                     (int)data._M_h._M_before_begin._M_nxt);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    close(sockfd);
    _Var8 = sendmsg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sendmsg._M_dataplus._M_p == &sendmsg.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(_Var8._M_p);
  return __return_storage_ptr__;
}

Assistant:

response requests::get(std::string host,std::string uri,uint16_t port,
			   std::unordered_map<std::string,std::string> headers,
			   std::unordered_map<std::string,std::string> data,
			   CookieJar *cookie,
			   int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);

		int data_count=0;
		if(data.size()!=0)
			uri+="?";
		for(auto iter=data.begin();iter!=data.end();++iter){
			if(data_count>0)
				uri+="&";
			uri=uri+iter->first+"="+iter->second;
			data_count++;
		}
		//base header
		std::string sendmsg=
				"GET "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}